

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall dxil_spv::Converter::Impl::emit_global_heaps(Impl *this)

{
  uint uVar1;
  AnnotateHandleReference *pAVar2;
  AnnotateHandleReference *pAVar3;
  ResourceRemappingInterface *pRVar4;
  pointer ptr;
  long lVar5;
  VulkanDescriptorType descriptor_type;
  bool bVar6;
  char cVar7;
  byte bVar8;
  ComponentType actual_component_type;
  int iVar10;
  Id IVar11;
  ulong uVar12;
  LoggingCallback p_Var13;
  void *pvVar14;
  ComponentType CVar15;
  char cVar16;
  bool bVar17;
  ResourceKind RVar18;
  undefined1 uVar19;
  BindlessInfo *info;
  undefined1 uVar20;
  _Hash_node_base *p_Var21;
  iterator iVar22;
  AnnotateHandleReference **ppAVar23;
  __normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference_**,_std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>_>
  __i;
  long lVar24;
  AnnotateHandleReference **ppAVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  AliasedAccess aliased_access;
  Vector<AnnotateHandleReference_*> annotations;
  VulkanSRVBinding vulkan_srv_binding;
  BindlessInfo local_1118;
  undefined1 local_10e8 [8];
  undefined8 uStack_10e0;
  pointer local_10d8;
  bool bStack_10d0;
  bool bStack_10cf;
  bool bStack_10ce;
  undefined1 uStack_10cd;
  uint32_t uStack_10cc;
  uint uStack_10c8;
  AnnotateHandleReference *local_10b8;
  pointer pRStack_10b0;
  undefined8 local_10a8;
  AnnotateHandleReference **local_1098;
  iterator iStack_1090;
  AnnotateHandleReference **local_1088;
  AnnotateHandleReference **local_1080;
  ShaderStage local_1074;
  undefined4 uStack_1070;
  undefined8 uStack_106c;
  undefined8 uStack_1064;
  uint uStack_105c;
  ShaderStage local_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  uint uStack_1040;
  uint local_103c;
  undefined1 local_1038 [8];
  undefined8 uStack_1030;
  pointer local_1028;
  VulkanBinding VStack_1020;
  VulkanBinding local_1008 [169];
  uint uVar9;
  
  local_1098 = (AnnotateHandleReference **)0x0;
  iStack_1090._M_current = (AnnotateHandleReference **)0x0;
  local_1088 = (AnnotateHandleReference **)0x0;
  p_Var21 = (this->llvm_annotate_handle_uses)._M_h._M_before_begin._M_nxt;
  if (p_Var21 != (_Hash_node_base *)0x0) {
    do {
      local_1038 = (undefined1  [8])(p_Var21 + 2);
      if (iStack_1090._M_current == local_1088) {
        std::
        vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>
        ::_M_realloc_insert<dxil_spv::Converter::Impl::AnnotateHandleReference*>
                  ((vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>
                    *)&local_1098,iStack_1090,(AnnotateHandleReference **)local_1038);
      }
      else {
        *iStack_1090._M_current = (AnnotateHandleReference *)local_1038;
        iStack_1090._M_current = iStack_1090._M_current + 1;
      }
      iVar22._M_current = iStack_1090._M_current;
      ppAVar23 = local_1098;
      p_Var21 = p_Var21->_M_nxt;
    } while (p_Var21 != (_Hash_node_base *)0x0);
    if (local_1098 != iStack_1090._M_current) {
      lVar24 = (long)iStack_1090._M_current - (long)local_1098;
      uVar12 = lVar24 >> 3;
      lVar5 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::Converter::Impl::emit_global_heaps()::__0>>
                (local_1098,iStack_1090._M_current,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar24 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::Converter::Impl::emit_global_heaps()::__0>>
                  (ppAVar23);
      }
      else {
        ppAVar25 = ppAVar23 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::Converter::Impl::emit_global_heaps()::__0>>
                  (ppAVar23);
        for (; ppAVar25 != iVar22._M_current; ppAVar25 = ppAVar25 + 1) {
          pAVar2 = ppAVar25[-1];
          pAVar3 = *ppAVar25;
          uVar9 = pAVar3->ordinal;
          uVar1 = pAVar2->ordinal;
          ppAVar23 = ppAVar25;
          while (uVar9 < uVar1) {
            *ppAVar23 = pAVar2;
            pAVar2 = ppAVar23[-2];
            ppAVar23 = ppAVar23 + -1;
            uVar1 = pAVar2->ordinal;
          }
          *ppAVar23 = pAVar3;
        }
      }
    }
  }
  if (local_1098 != iStack_1090._M_current) {
    local_1080 = iStack_1090._M_current;
    iVar22._M_current = iStack_1090._M_current;
    ppAVar23 = local_1098;
LAB_0011a15e:
    pAVar2 = *ppAVar23;
    local_10d8 = (pointer)0x0;
    bStack_10d0 = false;
    bStack_10cf = false;
    uStack_10cd = 0;
    uStack_10cc = 0;
    uStack_10e0._0_1_ = Invalid;
    uStack_10e0._1_3_ = 0;
    uStack_10e0._4_4_ = ImageFormatUnknown;
    uStack_10c8 = 0;
    RVar18 = pAVar2->resource_kind;
    local_10e8[0] = pAVar2->resource_type;
    CVar15 = U32;
    if (local_10e8[0] == CBV) {
LAB_0011a185:
      actual_component_type = CVar15;
      bStack_10ce = false;
      local_10e8[1] = actual_component_type;
    }
    else {
      if ((byte)(RVar18 - RawBuffer) < 2) {
        if (local_10e8[0] == UAV) {
          uStack_10e0._0_1_ = Invalid;
          uStack_10e0._1_3_ = 0;
          uStack_10e0._4_4_ = ImageFormatR32ui;
        }
        goto LAB_0011a185;
      }
      bVar8 = pAVar2->component_type - SNormF16;
      uVar9 = (uint)(0xa0a09090808 >> (bVar8 * '\b' & 0x3f));
      if (5 < bVar8) {
        uVar9 = (uint)pAVar2->component_type;
      }
      actual_component_type = (ComponentType)uVar9;
      CVar15 = U64;
      if ((pAVar2->tracking).has_atomic_64bit != false) goto LAB_0011a185;
      if (actual_component_type == F16) {
        local_10e8[1] = F32;
      }
      else if ((uVar9 & 0xff) == 3) {
        local_10e8[1] = U32;
      }
      else {
        CVar15 = actual_component_type;
        if ((uVar9 & 0xff) != 2) goto LAB_0011a185;
        local_10e8[1] = I32;
      }
      bStack_10ce = true;
    }
    local_10e8._2_6_ = 0;
    uStack_10e0 = (pointer)CONCAT71(uStack_10e0._1_7_,RVar18);
    if (local_10e8[0] == UAV) {
      cVar7 = pAVar2->coherent;
      if ((bool)cVar7 == true) {
        (this->execution_mode_meta).declares_globallycoherent_uav = true;
      }
      cVar16 = pAVar2->rov;
      if ((bool)cVar16 == true) {
        (this->execution_mode_meta).declares_rov = true;
      }
      if ((this->shader_analysis).require_uav_thread_group_coherence == true) {
        pAVar2->coherent = true;
        cVar7 = '\x01';
      }
      if ((byte)(RVar18 - RawBuffer) < 2) {
        (pAVar2->tracking).has_read = true;
        (pAVar2->tracking).has_written = true;
        uVar19 = 1;
        uVar20 = 1;
      }
      else {
        uVar20 = (pAVar2->tracking).has_read;
        uVar19 = (pAVar2->tracking).has_written;
      }
      if (cVar7 != '\0') {
        cVar16 = '\x01';
      }
      local_10d8 = (pointer)((ulong)CONCAT12(cVar16,CONCAT11(uVar19,uVar20)) << 0x20);
      bVar6 = get_uav_image_format
                        (this,RVar18,actual_component_type,&pAVar2->tracking,
                         (ImageFormat *)((long)&uStack_10e0 + 4));
      if (bVar6) {
        RVar18 = (ResourceKind)uStack_10e0;
        goto LAB_0011a251;
      }
      goto switchD_0011a2da_default;
    }
LAB_0011a251:
    uVar9 = -pAVar2->stride & pAVar2->stride;
    if (RVar18 == RawBuffer) {
      uVar9 = 0x10;
    }
    local_1074 = get_remapping_stage(this->execution_model);
    uStack_1070 = CONCAT31(uStack_1070._1_3_,RVar18);
    uStack_106c = 0xffffffff00000000;
    uStack_1064 = 0xffffffffffffffff;
    local_10b8 = (AnnotateHandleReference *)0x0;
    pRStack_10b0 = (pointer)0x0;
    local_10a8 = (pointer)0x0;
    pRVar4 = this->resource_mapping_iface;
    uStack_105c = uVar9;
    if (pRVar4 == (ResourceRemappingInterface *)0x0) goto switchD_0011a2da_default;
    switch((ulong)local_10e8 & 0xff) {
    case 0:
      VStack_1020.root_constant_index = 0;
      VStack_1020.bindless.heap_root_offset._0_2_ = 0;
      VStack_1020.bindless.heap_root_offset._2_2_ = 0;
      VStack_1020.bindless.use_heap = false;
      VStack_1020.bindless._5_3_ = 0;
      VStack_1020.descriptor_type._0_2_ = Identity;
      VStack_1020.descriptor_type._2_2_ = Identity >> 0x10;
      local_1028 = (pointer)0x0;
      VStack_1020._0_6_ = 0;
      VStack_1020.binding._2_2_ = 0;
      local_1038 = (undefined1  [8])0x0;
      uStack_1030 = (pointer)0x0;
      iVar10 = (*pRVar4->_vptr_ResourceRemappingInterface[2])
                         (pRVar4,&local_1074,(VulkanBinding *)local_1038);
      iVar22._M_current = local_1080;
      local_10b8 = (AnnotateHandleReference *)local_1038;
      pRStack_10b0 = uStack_1030;
      local_10a8 = local_1028;
      cVar7 = get_ssbo_offset_buffer_id
                        (this,&pAVar2->offset_buffer_id,(VulkanBinding *)local_1038,&VStack_1020,
                         pAVar2->resource_kind,uVar9);
      if ((char)iVar10 != '\0') goto joined_r0x0011a576;
      break;
    case 1:
      local_1008[0].descriptor_set = 0;
      local_1008[0].binding = 0;
      local_1008[0].root_constant_index = 0;
      local_1008[0].bindless.heap_root_offset = 0;
      VStack_1020.root_constant_index = 0;
      VStack_1020.bindless.heap_root_offset._0_2_ = 0;
      VStack_1020.bindless.heap_root_offset._2_2_ = 0;
      VStack_1020.bindless.use_heap = false;
      VStack_1020.bindless._5_3_ = 0;
      VStack_1020.descriptor_type._0_2_ = Identity;
      VStack_1020.descriptor_type._2_2_ = Identity >> 0x10;
      local_1028 = (pointer)0x0;
      VStack_1020._0_6_ = 0;
      VStack_1020.binding._2_2_ = 0;
      local_1038 = (undefined1  [8])0x0;
      uStack_1030 = (pointer)0x0;
      local_1008[0].bindless.use_heap = false;
      local_1008[0].bindless._5_3_ = 0;
      local_1008[0].descriptor_type = Identity;
      uStack_1054 = uStack_1070;
      uStack_1050 = 0;
      uStack_104c = 0xffffffff;
      uStack_1048 = 0xffffffff;
      uStack_1044 = 0xffffffff;
      local_103c = (uint)pAVar2->counter;
      local_1058 = local_1074;
      uStack_1040 = uVar9;
      iVar10 = (*pRVar4->_vptr_ResourceRemappingInterface[4])
                         (pRVar4,&local_1058,(VulkanBinding *)local_1038);
      local_10b8 = (AnnotateHandleReference *)local_1038;
      pRStack_10b0 = uStack_1030;
      local_10a8 = local_1028;
      bVar6 = get_ssbo_offset_buffer_id
                        (this,&pAVar2->offset_buffer_id,(VulkanBinding *)local_1038,local_1008,
                         pAVar2->resource_kind,uVar9);
      iVar22._M_current = local_1080;
      if (bVar6) {
        if (pAVar2->counter == true) {
          local_1118.descriptor_type = Identity;
          local_1118.uav_read = false;
          local_1118.uav_written = false;
          local_1118.uav_coherent = false;
          local_1118.counters = false;
          local_1118.offsets = false;
          local_1118.aliased = false;
          local_1118.relaxed_precision = false;
          local_1118._27_1_ = 0;
          local_1118.kind = Invalid;
          local_1118._9_2_ = 0;
          local_1118._11_1_ = 0;
          local_1118.format = ImageFormatUnknown;
          (pAVar2->counter_reference).push_constant_member = 0xffffffff;
          (pAVar2->counter_reference).stride = 4;
          (pAVar2->counter_reference).bindless = true;
          (pAVar2->counter_reference).base_resource_is_array = true;
          local_1118._0_8_ = (AnnotateHandleReference *)0x501;
          local_1118._28_8_ = CONCAT26(VStack_1020.binding._2_2_,VStack_1020._0_6_);
          if (((this->options).physical_storage_buffer == true) &&
             (CONCAT22(VStack_1020.descriptor_type._2_2_,(undefined2)VStack_1020.descriptor_type) !=
              2)) {
            local_1118.counters = true;
            RVar18 = RawBuffer;
          }
          else {
            local_1118.kind = RawBuffer;
            local_1118.uav_read = true;
            local_1118.uav_written = true;
            local_1118.format = ImageFormatR32ui;
            RVar18 = TypedBuffer;
          }
          (pAVar2->counter_reference).resource_kind = RVar18;
          IVar11 = create_bindless_heap_variable(this,&local_1118);
          (pAVar2->counter_reference).var_id = IVar11;
        }
        cVar7 = (char)iVar10;
        goto joined_r0x0011a576;
      }
      break;
    case 2:
      local_1118.descriptor_type = Identity;
      local_1118.uav_read = false;
      local_1118.uav_written = false;
      local_1118.uav_coherent = false;
      local_1118.counters = false;
      local_1118.offsets = false;
      local_1118.aliased = false;
      local_1118.relaxed_precision = false;
      local_1118._27_1_ = 0;
      local_1118._0_8_ = (AnnotateHandleReference *)0x0;
      local_1118.kind = Invalid;
      local_1118._9_2_ = 0;
      local_1118._11_1_ = 0;
      local_1118.format = ImageFormatUnknown;
      iVar10 = (*pRVar4->_vptr_ResourceRemappingInterface[5])(pRVar4,&local_1074,&local_1118);
      cVar7 = (char)iVar10;
      if (local_1118.offsets != true) {
        pRStack_10b0 = (pointer)CONCAT44(local_1118.format,
                                         CONCAT13(local_1118._11_1_,
                                                  CONCAT21(local_1118._9_2_,local_1118.kind)));
        local_10a8 = (pointer)CONCAT44(4,local_1118.descriptor_type);
        local_10b8 = (AnnotateHandleReference *)local_1118._0_8_;
        goto joined_r0x0011a576;
      }
      p_Var13 = get_thread_log_callback();
      if (p_Var13 == (LoggingCallback)0x0) {
        emit_global_heaps();
        break;
      }
      VStack_1020.root_constant_index = 0x362e3620;
      VStack_1020.bindless.heap_root_offset._0_2_ = 0x6220;
      VStack_1020.bindless.heap_root_offset._2_2_ = 0x6e69;
      VStack_1020.bindless.use_heap = true;
      VStack_1020.bindless._5_3_ = 0x73656c;
      VStack_1020.descriptor_type._0_2_ = 0x2e73;
      VStack_1020.descriptor_type._2_2_ = 10;
      local_1028 = (pointer)0x746e6174736e6f63;
      VStack_1020._0_6_ = 0x20726f662073;
      VStack_1020.binding._2_2_ = 0x4d53;
      uVar26._0_1_ = 'C';
      uVar26._1_1_ = 'a';
      uVar26._2_1_ = 'n';
      uVar26._3_1_ = 'n';
      uVar27._0_1_ = 'o';
      uVar27._1_1_ = 't';
      uVar27._2_1_ = ' ';
      uVar27._3_1_ = 'u';
      uVar28._0_1_ = 's';
      uVar28._1_1_ = 'e';
      uVar28._2_1_ = ' ';
      uVar28._3_1_ = 'p';
      uVar29._0_1_ = 'u';
      uVar29._1_1_ = 's';
      uVar29._2_1_ = 'h';
      uVar29._3_1_ = ' ';
LAB_0011a7a4:
      local_1038[4] = (char)uVar27;
      local_1038[5] = SUB41(uVar27,1);
      local_1038[6] = SUB41(uVar27,2);
      local_1038[7] = SUB41(uVar27,3);
      local_1038[0] = (char)uVar26;
      local_1038[1] = SUB41(uVar26,1);
      local_1038[2] = SUB41(uVar26,2);
      local_1038[3] = SUB41(uVar26,3);
      uStack_1030 = (pointer)CONCAT44(uVar29,uVar28);
      pvVar14 = get_thread_log_callback_userdata();
      (*p_Var13)(pvVar14,Error,local_1038);
      break;
    case 3:
      iVar10 = (*pRVar4->_vptr_ResourceRemappingInterface[3])(pRVar4,&local_1074,&local_10b8);
      cVar7 = (char)iVar10;
joined_r0x0011a576:
      if (cVar7 == '\0') break;
      if ((char)local_10a8 == '\0') {
        p_Var13 = get_thread_log_callback();
        if (p_Var13 != (LoggingCallback)0x0) {
          VStack_1020.root_constant_index = 0x62206562;
          VStack_1020.bindless.heap_root_offset._0_2_ = 0x6e69;
          VStack_1020.bindless.heap_root_offset._2_2_ = 0x6c64;
          VStack_1020.bindless.use_heap = true;
          VStack_1020.bindless._5_3_ = 0x2e7373;
          VStack_1020.descriptor_type._0_2_ = 10;
          local_1028 = (pointer)0x636e657265666572;
          VStack_1020._0_6_ = 0x73756d207365;
          VStack_1020.binding._2_2_ = 0x2074;
          uVar26._0_1_ = 'S';
          uVar26._1_1_ = 'M';
          uVar26._2_1_ = ' ';
          uVar26._3_1_ = '6';
          uVar27._0_1_ = '.';
          uVar27._1_1_ = '6';
          uVar27._2_1_ = ' ';
          uVar27._3_1_ = 'b';
          uVar28._0_1_ = 'i';
          uVar28._1_1_ = 'n';
          uVar28._2_1_ = 'd';
          uVar28._3_1_ = 'l';
          uVar29._0_1_ = 'e';
          uVar29._1_1_ = 's';
          uVar29._2_1_ = 's';
          uVar29._3_1_ = ' ';
          goto LAB_0011a7a4;
        }
        emit_global_heaps();
        break;
      }
      local_1118._28_8_ = local_1118._28_8_ & 0xffffffff00000000;
      local_1118._0_8_ = (AnnotateHandleReference *)0x0;
      local_1118.kind = Invalid;
      local_1118._9_2_ = 0;
      local_1118._11_1_ = 0;
      local_1118.format = ImageFormatUnknown;
      local_1118.descriptor_type = Identity;
      local_1118.uav_read = false;
      local_1118.uav_written = false;
      local_1118.uav_coherent = false;
      local_1118.counters = false;
      local_1118.offsets = false;
      local_1118.aliased = false;
      local_1118.relaxed_precision = false;
      local_10a8._4_4_ = (VulkanDescriptorType)((ulong)local_10a8 >> 0x20);
      descriptor_type = local_10a8._4_4_;
      bVar6 = analyze_aliased_access
                        (this,&pAVar2->tracking,descriptor_type,(AliasedAccess *)&local_1118);
      if (!bVar6) {
        if ((AnnotateHandleReference *)local_1118._0_8_ != (AnnotateHandleReference *)0x0) {
          free_in_thread((void *)local_1118._0_8_);
        }
        break;
      }
      uStack_10cc = (uint32_t)local_10b8;
      uStack_10c8 = (uint)((ulong)local_10b8 >> 0x20);
      local_10d8 = (pointer)CONCAT44(local_10d8._4_4_,local_10a8._4_4_);
      bStack_10cf = local_1118.offsets;
      (pAVar2->reference).bindless = true;
      (pAVar2->reference).base_resource_is_array = true;
      (pAVar2->reference).push_constant_member = 0xffffffff;
      (pAVar2->reference).stride = pAVar2->stride;
      (pAVar2->reference).resource_kind = pAVar2->resource_kind;
      bVar6 = pAVar2->rov;
      bVar17 = bVar6;
      if (pAVar2->coherent != false) {
        bVar17 = true;
      }
      (pAVar2->reference).coherent = bVar17;
      (pAVar2->reference).rov = bVar6;
      if (local_1118.offsets == true) {
        create_bindless_heap_variable_alias_group
                  ((Vector<Converter::Impl::RawDeclarationVariable> *)local_1038,this,
                   (BindlessInfo *)local_10e8,(Vector<RawDeclaration> *)&local_1118);
        ptr = (pAVar2->reference).var_alias_group.
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_start;
        (pAVar2->reference).var_alias_group.
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1038;
        (pAVar2->reference).var_alias_group.
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_finish = uStack_1030;
        (pAVar2->reference).var_alias_group.
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1028;
        local_1038 = (undefined1  [8])0x0;
        uStack_1030 = (pointer)0x0;
        local_1028 = (pointer)0x0;
        if ((ptr != (pointer)0x0) && (free_in_thread(ptr), local_1038 != (undefined1  [8])0x0)) {
          free_in_thread((void *)local_1038);
        }
      }
      else {
        if (local_1118.aliased == true) {
          uStack_1030 = uStack_10e0;
          VStack_1020.root_constant_index = uStack_10c8;
          local_1028 = local_10d8;
          VStack_1020._0_6_ =
               SUB86(CONCAT44(uStack_10cc,
                              CONCAT13(uStack_10cd,
                                       CONCAT12(bStack_10ce,CONCAT11(local_1118.offsets,bStack_10d0)
                                               ))),0);
          VStack_1020.binding._2_2_ = (undefined2)((ulong)local_10b8 >> 0x10);
          local_1038._2_6_ = local_10e8._2_6_;
          local_1038[0] = local_10e8[0];
          local_1038[1] = local_1118.relaxed_precision;
          local_1038._4_4_ = local_1118.desc_set;
          info = (BindlessInfo *)local_1038;
        }
        else {
          info = (BindlessInfo *)local_10e8;
        }
        IVar11 = create_bindless_heap_variable(this,info);
        (pAVar2->reference).var_id = IVar11;
      }
      (pAVar2->reference).aliased = local_1118.offsets;
      if ((AnnotateHandleReference *)local_1118._0_8_ != (AnnotateHandleReference *)0x0) {
        free_in_thread((void *)local_1118._0_8_);
      }
      ppAVar23 = ppAVar23 + 1;
      if (ppAVar23 == iVar22._M_current) goto LAB_0011a76c;
      goto LAB_0011a15e;
    }
switchD_0011a2da_default:
    bVar6 = false;
    goto LAB_0011a7c4;
  }
  bVar6 = true;
LAB_0011a7c4:
  if (local_1098 != (AnnotateHandleReference **)0x0) {
    free_in_thread(local_1098);
  }
  return bVar6;
LAB_0011a76c:
  bVar6 = true;
  goto LAB_0011a7c4;
}

Assistant:

bool Converter::Impl::emit_global_heaps()
{
	Vector<AnnotateHandleReference *> annotations;
	for (auto &use : llvm_annotate_handle_uses)
		annotations.push_back(&use.second);

	// Ensure reproducible codegen since we iterate over an unordered map.
	std::sort(annotations.begin(), annotations.end(),
	          [](const AnnotateHandleReference *a, const AnnotateHandleReference *b) {
	              return a->ordinal < b->ordinal;
	          });

	for (auto *annotation : annotations)
	{
		BindlessInfo info = {};

		auto actual_component_type = DXIL::ComponentType::U32;
		info.format = spv::ImageFormatUnknown;
		if (annotation->resource_type != DXIL::ResourceType::CBV &&
		    annotation->resource_kind != DXIL::ResourceKind::RawBuffer &&
		    annotation->resource_kind != DXIL::ResourceKind::StructuredBuffer)
		{
			actual_component_type = normalize_component_type(annotation->component_type);
			if (annotation->tracking.has_atomic_64bit)
			{
				// The component type in DXIL is u32, even if the resource itself is u64 in meta reflection data ...
				// This is also the case for signed components. Always use R64UI here.
				actual_component_type = DXIL::ComponentType::U64;
			}
		}
		else if (annotation->resource_type == DXIL::ResourceType::UAV)
		{
			info.format = spv::ImageFormatR32ui;
		}

		auto effective_component_type = get_effective_typed_resource_type(actual_component_type);

		info.type = annotation->resource_type;
		info.component = effective_component_type;
		info.kind = annotation->resource_kind;
		info.relaxed_precision = actual_component_type != effective_component_type &&
		                         component_type_is_16bit(actual_component_type);

		if (info.type == DXIL::ResourceType::UAV)
		{
			// See emit_uavs() for details around coherent and memory model shenanigans ...
			if (annotation->coherent)
				execution_mode_meta.declares_globallycoherent_uav = true;
			if (annotation->rov)
				execution_mode_meta.declares_rov = true;

			// Do not attempt to track read and write here to figure out if this resource in particular needs to be coherent.
			// It's plausible that the write and read can happen across
			// two different accesses to ResourceDescriptorHeap[]. Don't take any chances here ...
			if (shader_analysis.require_uav_thread_group_coherence)
				annotation->coherent = true;

			if (annotation->resource_kind == DXIL::ResourceKind::StructuredBuffer ||
			    annotation->resource_kind == DXIL::ResourceKind::RawBuffer)
			{
				// In case there is aliasing through different declarations,
				// we cannot emit NonWritable or NonReadable safely. Assume full read-write.
				// Be a bit careful with typed resources since it's not always supported with read-write + typed.
				annotation->tracking.has_read = true;
				annotation->tracking.has_written = true;
			}

			info.uav_coherent = annotation->coherent || annotation->rov;
			info.uav_read = annotation->tracking.has_read;
			info.uav_written = annotation->tracking.has_written;
			if (!get_uav_image_format(annotation->resource_kind, actual_component_type,
			                          annotation->tracking, info.format))
			{
				return false;
			}
		}

		unsigned stride = annotation->stride;
		unsigned alignment = info.kind == DXIL::ResourceKind::RawBuffer ? 16 : (stride & -int(stride));
		D3DBinding d3d_binding = {
			get_remapping_stage(execution_model), info.kind, 0,
			UINT32_MAX, UINT32_MAX, UINT32_MAX, alignment,
		};
		VulkanBinding vulkan_binding = {};

		bool remap_success = false;
		if (resource_mapping_iface)
		{
			switch (info.type)
			{
			case DXIL::ResourceType::SRV:
			{
				VulkanSRVBinding vulkan_srv_binding = {};
				remap_success = resource_mapping_iface->remap_srv(d3d_binding, vulkan_srv_binding);
				vulkan_binding = vulkan_srv_binding.buffer_binding;
				if (!get_ssbo_offset_buffer_id(annotation->offset_buffer_id, vulkan_srv_binding.buffer_binding,
				                               vulkan_srv_binding.offset_binding, annotation->resource_kind, alignment))
				{
					return false;
				}
				break;
			}

			case DXIL::ResourceType::UAV:
			{
				VulkanUAVBinding vulkan_uav_binding = {};
				D3DUAVBinding d3d_uav_binding = {};

				d3d_uav_binding.binding = d3d_binding;
				d3d_uav_binding.counter = annotation->counter;

				remap_success = resource_mapping_iface->remap_uav(d3d_uav_binding, vulkan_uav_binding);
				vulkan_binding = vulkan_uav_binding.buffer_binding;
				if (!get_ssbo_offset_buffer_id(annotation->offset_buffer_id, vulkan_uav_binding.buffer_binding,
											   vulkan_uav_binding.offset_binding, annotation->resource_kind, alignment))
				{
					return false;
				}

				if (annotation->counter)
				{
					auto &counter_binding = vulkan_uav_binding.counter_binding;
					BindlessInfo counter_info = {};

					annotation->counter_reference.base_resource_is_array = true;
					annotation->counter_reference.push_constant_member = UINT32_MAX;
					annotation->counter_reference.stride = 4;
					annotation->counter_reference.bindless = true;

					counter_info.type = DXIL::ResourceType::UAV;
					counter_info.component = DXIL::ComponentType::U32;
					counter_info.desc_set = counter_binding.descriptor_set;
					counter_info.binding = counter_binding.binding;

					if (options.physical_storage_buffer &&
					    counter_binding.descriptor_type != VulkanDescriptorType::TexelBuffer)
					{
						counter_info.kind = DXIL::ResourceKind::Invalid;
						counter_info.counters = true;
						annotation->counter_reference.resource_kind = DXIL::ResourceKind::RawBuffer;
					}
					else
					{
						counter_info.kind = DXIL::ResourceKind::RawBuffer;
						counter_info.uav_read = true;
						counter_info.uav_written = true;
						counter_info.uav_coherent = false;
						counter_info.format = spv::ImageFormatR32ui;
						annotation->counter_reference.resource_kind = DXIL::ResourceKind::TypedBuffer;
					}

					annotation->counter_reference.var_id = create_bindless_heap_variable(counter_info);
				}
				break;
			}

			case DXIL::ResourceType::CBV:
			{
				VulkanCBVBinding vulkan_cbv_binding = {};
				remap_success = resource_mapping_iface->remap_cbv(d3d_binding, vulkan_cbv_binding);
				if (vulkan_cbv_binding.push_constant)
				{
					LOGE("Cannot use push constants for SM 6.6 bindless.\n");
					return false;
				}
				vulkan_binding = vulkan_cbv_binding.buffer;
				vulkan_binding.descriptor_type = VulkanDescriptorType::UBO;
				break;
			}

			case DXIL::ResourceType::Sampler:
				remap_success = resource_mapping_iface->remap_sampler(d3d_binding, vulkan_binding);
				break;
			}
		}

		if (!remap_success)
			return false;

		if (!vulkan_binding.bindless.use_heap)
		{
			LOGE("SM 6.6 bindless references must be bindless.\n");
			return false;
		}

		AliasedAccess aliased_access;
		if (!analyze_aliased_access(annotation->tracking, vulkan_binding.descriptor_type, aliased_access))
			return false;

		info.desc_set = vulkan_binding.descriptor_set;
		info.binding = vulkan_binding.binding;
		info.descriptor_type = vulkan_binding.descriptor_type;
		info.aliased = aliased_access.requires_alias_decoration;

		annotation->reference.bindless = true;
		annotation->reference.base_resource_is_array = true;
		annotation->reference.push_constant_member = UINT32_MAX;
		annotation->reference.stride = annotation->stride;
		annotation->reference.resource_kind = annotation->resource_kind;
		annotation->reference.coherent = annotation->coherent || annotation->rov;
		annotation->reference.rov = annotation->rov;

		if (aliased_access.requires_alias_decoration)
		{
			annotation->reference.var_alias_group = create_bindless_heap_variable_alias_group(
			    info, aliased_access.raw_declarations);
		}
		else if (aliased_access.override_primary_component_types)
		{
			auto tmp_info = info;
			tmp_info.component = aliased_access.primary_component_type;
			tmp_info.raw_vecsize = aliased_access.primary_raw_vecsize;
			annotation->reference.var_id = create_bindless_heap_variable(tmp_info);
		}
		else
			annotation->reference.var_id = create_bindless_heap_variable(info);

		annotation->reference.aliased = aliased_access.requires_alias_decoration;
	}

	return true;
}